

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::anon_unknown_0::SanitizeNameForObjC
                   (string *__return_storage_ptr__,string *input,string *extension,
                   string *out_suffix_added)

{
  size_type sVar1;
  string *out_suffix_added_local;
  string *extension_local;
  string *input_local;
  
  sVar1 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(anonymous_namespace)::kReservedWords_abi_cxx11_,input);
  if (sVar1 == 0) {
    if (out_suffix_added != (string *)0x0) {
      std::__cxx11::string::clear();
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
  }
  else {
    if (out_suffix_added != (string *)0x0) {
      std::__cxx11::string::operator=((string *)out_suffix_added,(string *)extension);
    }
    std::operator+(__return_storage_ptr__,input,extension);
  }
  return __return_storage_ptr__;
}

Assistant:

string SanitizeNameForObjC(const string& input,
                           const string& extension,
                           string* out_suffix_added) {
  if (kReservedWords.count(input) > 0) {
    if (out_suffix_added) *out_suffix_added = extension;
    return input + extension;
  }
  if (out_suffix_added) out_suffix_added->clear();
  return input;
}